

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processConfig.cpp
# Opt level: O2

double stringToDouble(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *words,size_t pos,string *lineID)

{
  int *piVar1;
  pointer pbVar2;
  allocator local_113;
  allocator local_112;
  allocator local_111;
  double local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  string local_68;
  char *end;
  
  pbVar2 = (words->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(words->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) < pos + 1) {
    std::__cxx11::string::string((string *)&local_68,"Utils::adios_iotest",&local_111);
    std::__cxx11::string::string((string *)&local_88,"processConfig",&local_112);
    std::__cxx11::string::string((string *)&local_a8,"stringToDouble",&local_113);
    std::operator+(&local_108,"Line for ",lineID);
    std::operator+(&local_e8,&local_108,
                   " is invalid. Missing floating point value at word position ");
    std::__cxx11::to_string((string *)&end,pos + 1);
    std::operator+(&local_c8,&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&end);
    adios2::helper::Throw<std::invalid_argument>(&local_68,&local_88,&local_a8,&local_c8,-1);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&end);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    pbVar2 = (words->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  piVar1 = __errno_location();
  *piVar1 = 0;
  local_110 = strtod(pbVar2[pos]._M_dataplus._M_p,&end);
  if ((*end != '\0') || (*piVar1 == 0x22)) {
    std::__cxx11::string::string((string *)&local_68,"Utils::adios_iotest",&local_111);
    std::__cxx11::string::string((string *)&local_88,"processConfig",&local_112);
    std::__cxx11::string::string((string *)&local_a8,"stringToDouble",&local_113);
    std::operator+(&local_108,"Invalid floating point value given for ",lineID);
    std::operator+(&local_e8,&local_108,": ");
    std::operator+(&local_c8,&local_e8,
                   (words->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + pos);
    adios2::helper::Throw<std::invalid_argument>(&local_68,&local_88,&local_a8,&local_c8,-1);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return local_110;
}

Assistant:

double stringToDouble(std::vector<std::string> &words, size_t pos, std::string lineID)
{
    if (words.size() < pos + 1)
    {
        adios2::helper::Throw<std::invalid_argument>(
            "Utils::adios_iotest", "processConfig", "stringToDouble",
            "Line for " + lineID + " is invalid. Missing floating point value at word position " +
                std::to_string(pos + 1));
    }

    char *end;
    errno = 0;
    double d = static_cast<double>(std::strtod(words[pos].c_str(), &end));
    if (end[0] || errno == ERANGE)
    {
        adios2::helper::Throw<std::invalid_argument>(
            "Utils::adios_iotest", "processConfig", "stringToDouble",
            "Invalid floating point value given for " + lineID + ": " + words[pos]);
    }
    return d;
}